

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

void __thiscall cfgfile::generator::cpp_generator_t::generate(cpp_generator_t *this,ostream *stream)

{
  bool bVar1;
  ostream *poVar2;
  ulong uVar3;
  reference ppnVar4;
  ostream *poVar5;
  ostream *in_RSI;
  long in_RDI;
  bool bVar6;
  const_namespace_ptr_t n;
  namespace_stack_t tmp;
  string guard;
  const_class_ptr_t c;
  namespace_stack_t nms;
  unsigned_long_long index;
  const_class_ptr_t in_stack_fffffffffffffd98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda0;
  allocator *paVar7;
  __normal_iterator<const_cfgfile::generator::cfg::namespace_t_**,_std::vector<const_cfgfile::generator::cfg::namespace_t_*,_std::allocator<const_cfgfile::generator::cfg::namespace_t_*>_>_>
  in_stack_fffffffffffffda8;
  __normal_iterator<const_cfgfile::generator::cfg::namespace_t_**,_std::vector<const_cfgfile::generator::cfg::namespace_t_*,_std::allocator<const_cfgfile::generator::cfg::namespace_t_*>_>_>
  in_stack_fffffffffffffdb0;
  model_t *in_stack_fffffffffffffdb8;
  ostream *in_stack_fffffffffffffdc0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffdd0;
  value_type pnVar8;
  undefined7 in_stack_fffffffffffffdd8;
  undefined1 in_stack_fffffffffffffddf;
  ostream *in_stack_fffffffffffffde0;
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [32];
  namespace_t **local_138;
  namespace_t **local_130;
  namespace_t *local_128;
  allocator local_101;
  string local_100 [39];
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [48];
  string local_58 [32];
  class_t *local_38;
  long local_18;
  ostream *local_10;
  
  local_18 = 0;
  local_10 = in_RSI;
  std::
  vector<const_cfgfile::generator::cfg::namespace_t_*,_std::allocator<const_cfgfile::generator::cfg::namespace_t_*>_>
  ::vector((vector<const_cfgfile::generator::cfg::namespace_t_*,_std::allocator<const_cfgfile::generator::cfg::namespace_t_*>_>
            *)0x12d5c0);
  local_38 = (class_t *)0x0;
  cfg::model_t::include_guard_abi_cxx11_(*(model_t **)(in_RDI + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"__INCLUDED",&local_89);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffda8._M_current,in_stack_fffffffffffffda0);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  poVar2 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"\n#ifndef ",&local_b1);
  poVar2 = std::operator<<(poVar2,local_b0);
  poVar2 = std::operator<<(poVar2,local_58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"\n#define ",&local_d9);
  poVar2 = std::operator<<(poVar2,local_d8);
  poVar2 = std::operator<<(poVar2,local_58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"\n\n",&local_101);
  std::operator<<(poVar2,local_100);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  cfg::model_t::global_includes_abi_cxx11_(*(model_t **)(in_RDI + 8));
  cfg::model_t::relative_includes_abi_cxx11_(*(model_t **)(in_RDI + 8));
  generate_includes(in_stack_fffffffffffffde0,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),
                    in_stack_fffffffffffffdd0);
  while (local_38 = cfg::model_t::next_class
                              (in_stack_fffffffffffffdb8,
                               (unsigned_long_long)in_stack_fffffffffffffdb0._M_current),
        local_38 != (const_class_ptr_t)0x0) {
    local_18 = local_18 + 1;
    std::
    vector<const_cfgfile::generator::cfg::namespace_t_*,_std::allocator<const_cfgfile::generator::cfg::namespace_t_*>_>
    ::vector((vector<const_cfgfile::generator::cfg::namespace_t_*,_std::allocator<const_cfgfile::generator::cfg::namespace_t_*>_>
              *)0x12d88f);
    for (local_128 = cfg::class_t::parent_namespace(local_38); local_128 != (namespace_t *)0x0;
        local_128 = cfg::namespace_t::parent_namespace(local_128)) {
      cfg::namespace_t::name_abi_cxx11_(local_128);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        std::
        vector<const_cfgfile::generator::cfg::namespace_t_*,_std::allocator<const_cfgfile::generator::cfg::namespace_t_*>_>
        ::push_back((vector<const_cfgfile::generator::cfg::namespace_t_*,_std::allocator<const_cfgfile::generator::cfg::namespace_t_*>_>
                     *)in_stack_fffffffffffffdb0._M_current,in_stack_fffffffffffffda8._M_current);
      }
    }
    bVar1 = std::
            vector<const_cfgfile::generator::cfg::namespace_t_*,_std::allocator<const_cfgfile::generator::cfg::namespace_t_*>_>
            ::empty((vector<const_cfgfile::generator::cfg::namespace_t_*,_std::allocator<const_cfgfile::generator::cfg::namespace_t_*>_>
                     *)in_stack_fffffffffffffdb0._M_current);
    if (bVar1) {
      while (bVar1 = std::
                     vector<const_cfgfile::generator::cfg::namespace_t_*,_std::allocator<const_cfgfile::generator::cfg::namespace_t_*>_>
                     ::empty((vector<const_cfgfile::generator::cfg::namespace_t_*,_std::allocator<const_cfgfile::generator::cfg::namespace_t_*>_>
                              *)in_stack_fffffffffffffdb0._M_current), ((bVar1 ^ 0xffU) & 1) != 0) {
        close_namespace((ostream *)in_stack_fffffffffffffda0,
                        (namespace_stack_t *)in_stack_fffffffffffffd98);
      }
    }
    else {
      local_130 = (namespace_t **)
                  std::
                  vector<const_cfgfile::generator::cfg::namespace_t_*,_std::allocator<const_cfgfile::generator::cfg::namespace_t_*>_>
                  ::begin((vector<const_cfgfile::generator::cfg::namespace_t_*,_std::allocator<const_cfgfile::generator::cfg::namespace_t_*>_>
                           *)in_stack_fffffffffffffd98);
      local_138 = (namespace_t **)
                  std::
                  vector<const_cfgfile::generator::cfg::namespace_t_*,_std::allocator<const_cfgfile::generator::cfg::namespace_t_*>_>
                  ::end((vector<const_cfgfile::generator::cfg::namespace_t_*,_std::allocator<const_cfgfile::generator::cfg::namespace_t_*>_>
                         *)in_stack_fffffffffffffd98);
      std::
      reverse<__gnu_cxx::__normal_iterator<cfgfile::generator::cfg::namespace_t_const**,std::vector<cfgfile::generator::cfg::namespace_t_const*,std::allocator<cfgfile::generator::cfg::namespace_t_const*>>>>
                (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      while( true ) {
        bVar1 = std::
                vector<const_cfgfile::generator::cfg::namespace_t_*,_std::allocator<const_cfgfile::generator::cfg::namespace_t_*>_>
                ::empty((vector<const_cfgfile::generator::cfg::namespace_t_*,_std::allocator<const_cfgfile::generator::cfg::namespace_t_*>_>
                         *)in_stack_fffffffffffffdb0._M_current);
        bVar6 = false;
        if (!bVar1) {
          ppnVar4 = std::
                    vector<const_cfgfile::generator::cfg::namespace_t_*,_std::allocator<const_cfgfile::generator::cfg::namespace_t_*>_>
                    ::back((vector<const_cfgfile::generator::cfg::namespace_t_*,_std::allocator<const_cfgfile::generator::cfg::namespace_t_*>_>
                            *)in_stack_fffffffffffffda0);
          pnVar8 = *ppnVar4;
          ppnVar4 = std::
                    vector<const_cfgfile::generator::cfg::namespace_t_*,_std::allocator<const_cfgfile::generator::cfg::namespace_t_*>_>
                    ::back((vector<const_cfgfile::generator::cfg::namespace_t_*,_std::allocator<const_cfgfile::generator::cfg::namespace_t_*>_>
                            *)in_stack_fffffffffffffda0);
          bVar6 = pnVar8 != *ppnVar4;
        }
        if (!bVar6) break;
        close_namespace((ostream *)in_stack_fffffffffffffda0,
                        (namespace_stack_t *)in_stack_fffffffffffffd98);
      }
      bVar1 = std::
              vector<const_cfgfile::generator::cfg::namespace_t_*,_std::allocator<const_cfgfile::generator::cfg::namespace_t_*>_>
              ::empty((vector<const_cfgfile::generator::cfg::namespace_t_*,_std::allocator<const_cfgfile::generator::cfg::namespace_t_*>_>
                       *)in_stack_fffffffffffffdb0._M_current);
      if (bVar1) {
        std::
        vector<const_cfgfile::generator::cfg::namespace_t_*,_std::allocator<const_cfgfile::generator::cfg::namespace_t_*>_>
        ::swap((vector<const_cfgfile::generator::cfg::namespace_t_*,_std::allocator<const_cfgfile::generator::cfg::namespace_t_*>_>
                *)in_stack_fffffffffffffdb0._M_current,
               (vector<const_cfgfile::generator::cfg::namespace_t_*,_std::allocator<const_cfgfile::generator::cfg::namespace_t_*>_>
                *)in_stack_fffffffffffffda8._M_current);
        start_namespaces(in_stack_fffffffffffffdc0,(namespace_stack_t *)in_stack_fffffffffffffdb8);
      }
    }
    generate_cpp_classes((ostream *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    std::
    vector<const_cfgfile::generator::cfg::namespace_t_*,_std::allocator<const_cfgfile::generator::cfg::namespace_t_*>_>
    ::~vector((vector<const_cfgfile::generator::cfg::namespace_t_*,_std::allocator<const_cfgfile::generator::cfg::namespace_t_*>_>
               *)in_stack_fffffffffffffdb0._M_current);
  }
  local_38 = (class_t *)0x0;
  while (bVar1 = std::
                 vector<const_cfgfile::generator::cfg::namespace_t_*,_std::allocator<const_cfgfile::generator::cfg::namespace_t_*>_>
                 ::empty((vector<const_cfgfile::generator::cfg::namespace_t_*,_std::allocator<const_cfgfile::generator::cfg::namespace_t_*>_>
                          *)in_stack_fffffffffffffdb0._M_current), ((bVar1 ^ 0xffU) & 1) != 0) {
    close_namespace((ostream *)in_stack_fffffffffffffda0,
                    (namespace_stack_t *)in_stack_fffffffffffffd98);
  }
  paVar7 = &local_159;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"#endif // ",paVar7);
  poVar2 = std::operator<<(local_10,local_158);
  poVar5 = std::operator<<(poVar2,local_58);
  paVar7 = &local_181;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"\n",paVar7);
  std::operator<<(poVar5,local_180);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::__cxx11::string::~string(local_58);
  std::
  vector<const_cfgfile::generator::cfg::namespace_t_*,_std::allocator<const_cfgfile::generator::cfg::namespace_t_*>_>
  ::~vector((vector<const_cfgfile::generator::cfg::namespace_t_*,_std::allocator<const_cfgfile::generator::cfg::namespace_t_*>_>
             *)poVar2);
  return;
}

Assistant:

void
cpp_generator_t::generate( std::ostream & stream ) const
{
	unsigned long long index = 0;

	namespace_stack_t nms;

	cfg::const_class_ptr_t c = 0;

	const std::string guard = m_model.include_guard() +
		std::string( "__INCLUDED" );

	stream << std::string( "\n#ifndef " ) << guard
		<< std::string( "\n#define " ) << guard
		<< std::string( "\n\n" );

	generate_includes( stream, m_model.global_includes(),
		m_model.relative_includes() );

	while( ( c = m_model.next_class( index ) ) )
	{
		++index;

		namespace_stack_t tmp;

		const_namespace_ptr_t n = c->parent_namespace();

		while( n )
		{
			if( !n->name().empty() )
				tmp.push_back( n );

			n = n->parent_namespace();
		}

		if( !tmp.empty() )
		{
			std::reverse( tmp.begin(), tmp.end() );

			while( !nms.empty() && nms.back() != tmp.back() )
				close_namespace( stream, nms );

			if( nms.empty() )
			{
				nms.swap( tmp );

				start_namespaces( stream, nms );
			}
		}
		else
		{
			while( !nms.empty() )
				close_namespace( stream, nms );
		}

		generate_cpp_classes( stream, c );
	}

	while( !nms.empty() )
		close_namespace( stream, nms );

	stream << std::string( "#endif // " ) << guard
		<< std::string( "\n" );
}